

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

void llb_build_key_destroy(llb_build_key_t *key)

{
  llb_build_key_t *key_local;
  
  if (key != (llb_build_key_t *)0x0) {
    anon_unknown.dwarf_1e10c2::CAPIBuildKey::~CAPIBuildKey((CAPIBuildKey *)key);
    operator_delete(key,0x38);
  }
  return;
}

Assistant:

void llb_build_key_destroy(llb_build_key_t *key) {
  delete (CAPIBuildKey *)key;
}